

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ClrDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,ClrDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  DWORD flags;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QString flagInfo;
  QStringList list;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  QString local_90;
  QArrayDataPointer<QString> local_78;
  undefined1 local_58 [8];
  _Rb_tree_node_base _Stack_50;
  
  oVar3 = DataDirEntryWrapper::getDirEntryAddress(&this->super_DataDirEntryWrapper);
  pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])(pEVar1,oVar3,2,0x48,0)
  ;
  if ((CONCAT44(extraout_var,iVar2) == 0) || (fieldId != 5)) {
    QVar6.m_data = (storage_type *)0x0;
    QVar6.m_size = (qsizetype)local_58;
    QString::fromUtf8(QVar6);
    (__return_storage_ptr__->d).d = (Data *)local_58;
    (__return_storage_ptr__->d).ptr = (char16_t *)_Stack_50._0_8_;
    (__return_storage_ptr__->d).size = (qsizetype)_Stack_50._M_parent;
  }
  else {
    getFlagsSet((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                local_58,(ClrDirWrapper *)(ulong)*(uint *)(CONCAT44(extraout_var,iVar2) + 0x10),
                flags);
    local_78.d = (Data *)0x0;
    local_78.ptr = (QString *)0x0;
    local_78.size = 0;
    if (_Stack_50._M_left != &_Stack_50) {
      p_Var4 = _Stack_50._M_left;
      do {
        translateFlag(&local_90,p_Var4[1]._M_color);
        if (local_90.d.size != 0) {
          QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                    ((QMovableArrayOps<QString> *)&local_78,local_78.size,&local_90);
        }
        if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
          }
        }
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      } while (p_Var4 != &_Stack_50);
    }
    QVar5.m_data = (storage_type *)0x1;
    QVar5.m_size = (qsizetype)&local_90;
    QString::fromUtf8(QVar5);
    if (local_90.d.ptr == (char16_t *)0x0) {
      local_90.d.ptr = (char16_t *)&QString::_empty;
    }
    QtPrivate::QStringList_join
              ((QList *)__return_storage_ptr__,(QChar *)&local_78,(longlong)local_90.d.ptr);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
      }
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFieldContent(size_t fieldId)
{
    const pe::IMAGE_COR20_HEADER* d = clrDir();
    if (!d) return "";
    
    if (fieldId != FLAGS) return "";
    
    std::set<DWORD> flagsSet = ClrDirWrapper::getFlagsSet(d->Flags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = ClrDirWrapper::translateFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(";");
}